

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textreader.hpp
# Opt level: O2

string * __thiscall
TextReader::read_quoted_abi_cxx11_(string *__return_storage_ptr__,TextReader *this)

{
  string *result;
  allocator local_39;
  string local_38;
  
  load_next_token(this);
  if (this->current_token_type_ == ttQuoted) {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&this->current_line_);
    this->current_token_pos_ = this->current_token_pos_ + this->current_token_len_;
    this->current_token_len_ = 0;
    this->current_token_type_ = ttUnknown;
  }
  else {
    std::__cxx11::string::string((string *)&local_38,"Expect a quoted value",&local_39);
    parse_error(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string read_quoted() {
        load_next_token();
        if (current_token_type_ == ttQuoted) {
            std::string result = current_line_.substr(current_token_pos_ + 1, current_token_len_ - 2);
            skip_token();
            return result;
        } else {
            parse_error("Expect a quoted value");
            return std::string();
        };
    }